

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_UInt32 tt_cmap8_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  FT_UInt32 FVar6;
  FT_UInt32 FVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  
  if (*pchar_code == 0xffffffff) {
    return 0;
  }
  uVar9 = *(uint *)(cmap->data + 0x200c);
  uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  FVar6 = 0;
  if (uVar9 == 0) {
    FVar7 = 0;
  }
  else {
    pbVar8 = cmap->data + 0x2010;
    uVar16 = *pchar_code + 1;
    do {
      uVar3 = (uint)*pbVar8;
      uVar4 = (uint)pbVar8[1];
      uVar5 = (uint)pbVar8[2];
      bVar1 = pbVar8[3];
      uVar15 = uVar4 * 0x10000 + uVar3 * 0x1000000 | uVar5 * 0x100 | (uint)bVar1;
      uVar2 = *(uint *)(pbVar8 + 4);
      uVar11 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = uVar15;
      if (uVar15 < uVar16) {
        uVar2 = uVar16;
      }
      uVar17 = uVar2;
      if (uVar2 <= uVar11) {
        iVar18 = (uint)pbVar8[8] * 0x1000000;
        iVar19 = (uint)pbVar8[9] * 0x10000;
        uVar10 = (uint)pbVar8[10] * 0x100;
        uVar12 = (uint)pbVar8[0xb];
        uVar20 = ~uVar2 + (uint)bVar1 + uVar5 * 0x100 + uVar3 * 0x1000000 + uVar4 * 0x10000;
        iVar13 = 0;
        do {
          uVar17 = uVar2 + iVar13;
          if (uVar20 < (iVar19 + iVar18 | uVar10 | uVar12)) goto LAB_0015d071;
          if (((iVar19 + uVar10 + (uint)pbVar8[0xb] + iVar18 + uVar2) - (uint)bVar1) +
              uVar5 * -0x100 + uVar4 * -0x10000 + uVar3 * -0x1000000 + iVar13 != 0) {
            if ((uint)((cmap->cmap).charmap.face)->num_glyphs <=
                ((iVar18 + uVar2 + iVar19 + uVar10 + uVar12) - (uint)bVar1) + uVar5 * -0x100 +
                uVar4 * -0x10000 + uVar3 * -0x1000000 + iVar13) goto LAB_0015d071;
            if (uVar15 < uVar16) {
              uVar15 = uVar16;
            }
            FVar7 = uVar15 + iVar13;
            FVar6 = ((iVar18 + iVar19 + uVar10 + uVar12 + uVar15) - (uint)bVar1) + uVar5 * -0x100 +
                    uVar4 * -0x10000 + uVar3 * -0x1000000 + iVar13;
            goto LAB_0015d098;
          }
          if (uVar17 == 0xffffffff) {
            FVar6 = 0;
            FVar7 = 0;
            goto LAB_0015d098;
          }
          iVar14 = iVar13 + 1;
          uVar17 = iVar13 + uVar2;
          uVar20 = uVar20 - 1;
          iVar13 = iVar14;
        } while (uVar17 < uVar11);
        uVar17 = uVar2 + iVar14;
      }
LAB_0015d071:
      uVar16 = uVar17;
      pbVar8 = pbVar8 + 0xc;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
    FVar7 = 0;
    FVar6 = 0;
  }
LAB_0015d098:
  *pchar_code = FVar7;
  return FVar6;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap8_char_next( TT_CMap     cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_Face    face       = cmap->cmap.charmap.face;
    FT_UInt32  result     = 0;
    FT_UInt32  char_code;
    FT_UInt    gindex     = 0;
    FT_Byte*   table      = cmap->data;
    FT_Byte*   p          = table + 8204;
    FT_UInt32  num_groups = TT_NEXT_ULONG( p );
    FT_UInt32  start, end, start_id;


    if ( *pchar_code >= 0xFFFFFFFFUL )
      return 0;

    char_code = *pchar_code + 1;

    p = table + 8208;

    for ( ; num_groups > 0; num_groups-- )
    {
      start    = TT_NEXT_ULONG( p );
      end      = TT_NEXT_ULONG( p );
      start_id = TT_NEXT_ULONG( p );

      if ( char_code < start )
        char_code = start;

    Again:
      if ( char_code <= end )
      {
        /* ignore invalid group */
        if ( start_id > 0xFFFFFFFFUL - ( char_code - start ) )
          continue;

        gindex = (FT_UInt)( start_id + ( char_code - start ) );

        /* does first element of group point to `.notdef' glyph? */
        if ( gindex == 0 )
        {
          if ( char_code >= 0xFFFFFFFFUL )
            break;

          char_code++;
          goto Again;
        }

        /* if `gindex' is invalid, the remaining values */
        /* in this group are invalid, too               */
        if ( gindex >= (FT_UInt)face->num_glyphs )
        {
          gindex = 0;
          continue;
        }

        result = char_code;
        break;
      }
    }

    *pchar_code = result;
    return gindex;
  }